

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

double __thiscall
hungarian_algorithm::HungarianSolver<double,unsigned_long,std::less<double>>::
getAssignment<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (HungarianSolver<double,unsigned_long,std::less<double>> *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *cost_function,vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  ulong col_00;
  const_reference pdVar1;
  size_t col;
  size_t row;
  double total_cost;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  assignment_map_adapter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map_local;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *cost_function_local;
  HungarianSolver<double,_unsigned_long,_std::less<double>_> *this_local;
  
  assignment_map_adapter.assignment_map_ = assignment_map;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  AssignmentMapAdapter
            ((AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&total_cost,assignment_map,*(unsigned_long *)this,*(unsigned_long *)(this + 8));
  row = *(size_t *)(this + 0xe0);
  for (col = 0; col < *(ulong *)this; col = col + 1) {
    col_00 = hungarian_algorithm::HungarianSolverBase::findInRow
                       ((vector *)this,(ulong)(this + 0x88));
    if (col_00 < *(ulong *)(this + 8)) {
      AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::insert((AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&total_cost,col,col_00);
      pdVar1 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()(cost_function,col,col_00);
      row = (size_t)(*pdVar1 + (double)row);
    }
  }
  return (double)row;
}

Assistant:

Cost getAssignment(const CostFunction& cost_function, AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, num_rows_, num_cols_);
    Cost total_cost(zero_cost_);
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col(findInRow(star_matrix_, row));
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
        total_cost += cost_function(Size(row), Size(col));
      }
    }
    return total_cost;
  }